

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::TestAES256CBC
          (CryptoTest *this,string *hexkey,string *hexiv,bool pad,string *hexin,string *hexout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_count **this_00;
  pointer puVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  undefined8 uVar7;
  string *psVar8;
  iterator pvVar9;
  string *psVar10;
  iterator pvVar11;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  size_t sVar12;
  long in_FS_OFFSET;
  bool bVar13;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  const_string file;
  const_string file_00;
  Span<const_unsigned_char> s;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_00;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  vector<unsigned_char,_std::allocator<unsigned_char>_> subdecrypted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> subout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sub;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decrypted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> realout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> correctout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  AES256CBCDecrypt dec;
  AES256CBCEncrypt enc;
  char *local_518;
  char *local_510;
  assertion_result local_508;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_488;
  uchar *local_470;
  int local_468;
  undefined4 uStack_464;
  long local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  assertion_result local_160;
  string *local_148;
  AES256CBCEncrypt local_13a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  psVar8 = hexin;
  psVar10 = hexout;
  ParseHex<unsigned_char>(&local_320,hex_str);
  hex_str_00._M_str = (hexiv->_M_dataplus)._M_p;
  hex_str_00._M_len = hexiv->_M_string_length;
  ParseHex<unsigned_char>(&local_338,hex_str_00);
  hex_str_01._M_str = (hexin->_M_dataplus)._M_p;
  hex_str_01._M_len = hexin->_M_string_length;
  ParseHex<unsigned_char>(&local_350,hex_str_01);
  hex_str_02._M_str = (hexout->_M_dataplus)._M_p;
  hex_str_02._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&local_368,hex_str_02);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_380,
             (CONCAT44(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                       (int)local_350.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) -
             (long)local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) + 0x10,(allocator_type *)&local_13a);
  AES256CBCEncrypt::AES256CBCEncrypt
            (&local_13a,
             local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pad);
  iVar3 = AES256CBCEncrypt::Encrypt
                    (&local_13a,
                     local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (int)local_350.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_350.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_380,(long)iVar3);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6d;
  file.m_begin = (iterator)&local_390;
  msg.m_end = (iterator)psVar10;
  msg.m_begin = (iterator)psVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a0,msg);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
       CONCAT44(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_,
                (int)local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish) -
       (long)local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2b0 = &local_180;
  local_180._M_dataplus._M_p = "realout.size() == correctout.size()";
  local_180._M_string_length = 0xeaa0bb;
  local_2c8[8] = false;
  local_2c8._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3a8 = "";
  pvVar9 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_2c8,1,0,WARN,(check_type)hexin,(size_t)&local_3b0,0x6d
            );
  this_00 = (shared_count **)&local_160.m_message.pn;
  boost::detail::shared_count::~shared_count((shared_count *)this_00);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6e;
  file_00.m_begin = (iterator)&local_3c0;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3d0,
             msg_00);
  puVar2 = local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar12 = (long)local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (sVar12 == CONCAT44(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)local_368.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) -
                (long)local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
    if (local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar13 = true;
    }
    else {
      iVar3 = bcmp(local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar12);
      bVar13 = iVar3 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  local_2e8._M_dataplus._M_p._0_1_ = bVar13;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  s.m_size = sVar12;
  s.m_data = puVar2;
  HexStr_abi_cxx11_(&local_1a0,s);
  paVar1 = &local_1c0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0," != ","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    uVar7 = local_1a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_1c0._M_string_length + local_1a0._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      uVar7 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_1c0._M_string_length + local_1a0._M_string_length) goto LAB_0036408e;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1c0,0,0,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
  }
  else {
LAB_0036408e:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar6 == paVar5) {
    local_180.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_180.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_180._M_dataplus._M_p = (pointer)paVar6;
  }
  local_180._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_180,(hexout->_M_dataplus)._M_p,hexout->_M_string_length);
  local_160._0_8_ = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ == paVar5) {
    local_160.m_message.pn.pi_ = (sp_counted_base *)paVar5->_M_allocated_capacity;
    local_148 = *(string **)((long)&pbVar4->field_2 + 8);
    local_160._0_8_ = this_00;
  }
  else {
    local_160.m_message.pn.pi_ = (sp_counted_base *)paVar5->_M_allocated_capacity;
  }
  local_160.m_message.px = (element_type *)pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_2c8[8] = false;
  local_2c8._0_8_ = &PTR__lazy_ostream_013d3bb0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3d8 = "";
  pvVar9 = (iterator)0x1;
  pvVar11 = (iterator)0x1;
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2e8,(lazy_ostream *)local_2c8,1,1,WARN,(check_type)hexin,
             (size_t)&local_3e0,0x6e);
  paVar5 = &local_1a0.field_2;
  if ((shared_count **)local_160._0_8_ != this_00) {
    operator_delete((void *)local_160._0_8_,
                    (ulong)((long)&(local_160.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar5) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2e8.field_2._M_allocated_capacity);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_3f8,
             CONCAT44(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_368.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) -
             (long)local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)local_2c8);
  AES256CBCDecrypt::AES256CBCDecrypt
            ((AES256CBCDecrypt *)local_2c8,
             local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pad);
  iVar3 = AES256CBCDecrypt::Decrypt
                    ((AES256CBCDecrypt *)local_2c8,
                     local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (int)local_368.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_368.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_3f8,(long)iVar3);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000075;
  file_01.m_begin = (iterator)&local_408;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_418,
             msg_01);
  local_180._M_dataplus._M_p._0_1_ =
       (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start ==
       CONCAT44(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_,
                (int)local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish) -
       (long)local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_180._M_string_length = 0;
  local_180.field_2._M_allocated_capacity = 0;
  local_1a0._M_dataplus._M_p = "decrypted.size() == in.size()";
  local_1a0._M_string_length = 0xeaa0d9;
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = &local_1a0;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_420 = "";
  pvVar9 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_180,(lazy_ostream *)&local_160,1,0,WARN,(check_type)hexin,
             (size_t)&local_428,0x75);
  paVar1 = &local_180.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x76;
  file_02.m_begin = (iterator)&local_438;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_448,
             msg_02);
  puVar2 = local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar12 = (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (sVar12 == CONCAT44(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)local_350.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) -
                (long)local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
    if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_308._M_dataplus._M_p._0_1_ = true;
    }
    else {
      iVar3 = bcmp(local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar12);
      local_308._M_dataplus._M_p._0_1_ = iVar3 == 0;
    }
  }
  else {
    local_308._M_dataplus._M_p._0_1_ = false;
  }
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  s_00.m_size = sVar12;
  s_00.m_data = puVar2;
  HexStr_abi_cxx11_(&local_1c0,s_00);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8," != ","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    uVar7 = local_1c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_2e8._M_string_length + local_1c0._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      uVar7 = local_2e8.field_2._M_allocated_capacity;
    }
    if (local_2e8._M_string_length + local_1c0._M_string_length <= (ulong)uVar7) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_2e8,0,0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      goto LAB_0036452e;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1c0,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
LAB_0036452e:
  local_1a0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p == paVar6) {
    local_1a0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1a0._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_1a0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1a0,(hexin->_M_dataplus)._M_p,hexin->_M_string_length);
  local_180._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == paVar6) {
    local_180.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_180._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_180.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_180._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_013d3bb0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = &local_180;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_450 = "";
  pvVar9 = (iterator)0x1;
  pvVar11 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_308,(lazy_ostream *)&local_160,1,1,WARN,(check_type)hexin,
             (size_t)&local_458,0x76);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar5) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_308.field_2._M_allocated_capacity);
  __last._M_current =
       (uchar *)CONCAT44(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)local_350.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
  if (local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != __last._M_current) {
    paVar1 = &local_180.field_2;
    __first._M_current =
         local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_470,__first,__last,
                 (allocator_type *)&local_160);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_488,(CONCAT44(uStack_464,local_468) - (long)local_470) + 0x10,
                 (allocator_type *)&local_160);
      iVar3 = AES256CBCEncrypt::Encrypt
                        (&local_13a,local_470,local_468 - (int)local_470,
                         local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_488,(long)iVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_4a0,
                   CONCAT44(local_488.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._4_4_,
                            (int)local_488.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish) -
                   (long)local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_160);
        iVar3 = AES256CBCDecrypt::Decrypt
                          ((AES256CBCDecrypt *)local_2c8,
                           local_488.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (int)local_488.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)local_488.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                           local_4a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_4a0,(long)iVar3);
        local_4b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_4a8 = "";
        local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x84;
        file_03.m_begin = (iterator)&local_4b0;
        msg_03.m_end = pvVar11;
        msg_03.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4c0
                   ,msg_03);
        local_180._M_dataplus._M_p._0_1_ =
             (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start ==
             CONCAT44(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_350.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) -
             (long)local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_180._M_string_length = 0;
        local_180.field_2._M_allocated_capacity = 0;
        local_1a0._M_dataplus._M_p = "decrypted.size() == in.size()";
        local_1a0._M_string_length = 0xeaa0d9;
        local_160.m_message.px =
             (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
        local_160._0_8_ = &PTR__lazy_ostream_013d3df0;
        local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_148 = &local_1a0;
        local_4d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_4c8 = "";
        pvVar9 = (iterator)0x1;
        pvVar11 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_180,(lazy_ostream *)&local_160,1,0,WARN,
                   (check_type)hexin,(size_t)&local_4d0,0x84);
        boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
        local_4e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_4d8 = "";
        local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x85;
        file_04.m_begin = (iterator)&local_4e0;
        msg_04.m_end = pvVar11;
        msg_04.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4f0
                   ,msg_04);
        puVar2 = local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar12 = (long)local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (sVar12 == CONCAT44(uStack_464,local_468) - (long)local_470) {
          if (local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_508.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(class_property<bool>)0x1;
          }
          else {
            iVar3 = bcmp(local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,local_470,sVar12);
            local_508.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(iVar3 == 0);
          }
        }
        else {
          local_508.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
        }
        local_508.m_message.px = (element_type *)0x0;
        local_508.m_message.pn.pi_ = (sp_counted_base *)0x0;
        s_01.m_size = sVar12;
        s_01.m_data = puVar2;
        HexStr_abi_cxx11_(&local_1c0,s_01);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8," != ","");
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          uVar7 = local_1c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_2e8._M_string_length + local_1c0._M_string_length) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            uVar7 = local_2e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_2e8._M_string_length + local_1c0._M_string_length)
          goto LAB_00364a09;
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_2e8,0,0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        }
        else {
LAB_00364a09:
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_1c0,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        }
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if (paVar6 == paVar5) {
          local_1a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_1a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_1a0._M_dataplus._M_p = (pointer)paVar6;
        }
        local_1a0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        paVar5->_M_local_buf[0] = '\0';
        s_02.m_size = CONCAT44(uStack_464,local_468) - (long)local_470;
        s_02.m_data = local_470;
        HexStr_abi_cxx11_(&local_308,s_02);
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          uVar7 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_308._M_string_length + local_1a0._M_string_length) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_308._M_dataplus._M_p._1_7_,local_308._M_dataplus._M_p._0_1_) !=
              &local_308.field_2) {
            uVar7 = local_308.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_308._M_string_length + local_1a0._M_string_length)
          goto LAB_00364b07;
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_308,0,0,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
        }
        else {
LAB_00364b07:
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_1a0,
                             (char *)CONCAT71(local_308._M_dataplus._M_p._1_7_,
                                              local_308._M_dataplus._M_p._0_1_),
                             local_308._M_string_length);
        }
        local_180._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p == paVar5) {
          local_180.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_180._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_180.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_180._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        paVar5->_M_local_buf[0] = '\0';
        local_160.m_message.px =
             (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
        local_160._0_8_ = &PTR__lazy_ostream_013d3bb0;
        local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_148 = &local_180;
        local_518 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
        ;
        local_510 = "";
        pvVar9 = (iterator)0x1;
        pvVar11 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  (&local_508,(lazy_ostream *)&local_160,1,1,WARN,(check_type)hexin,
                   (size_t)&local_518,0x85);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_308._M_dataplus._M_p._1_7_,local_308._M_dataplus._M_p._0_1_) !=
            &local_308.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_308._M_dataplus._M_p._1_7_,
                                      local_308._M_dataplus._M_p._0_1_),
                          local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        boost::detail::shared_count::~shared_count(&local_508.m_message.pn);
        if (local_4a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_4a0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_470 != (uchar *)0x0) {
        operator_delete(local_470,local_460 - (long)local_470);
      }
      __first._M_current = __first._M_current + 1;
      __last._M_current =
           (uchar *)CONCAT44(local_350.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (int)local_350.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
    } while (__first._M_current != __last._M_current);
  }
  AES256CBCDecrypt::~AES256CBCDecrypt((AES256CBCDecrypt *)local_2c8);
  if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  AES256CBCEncrypt::~AES256CBCEncrypt(&local_13a);
  if (local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_380.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_380.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_350.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestAES256CBC(const std::string &hexkey, const std::string &hexiv, bool pad, const std::string &hexin, const std::string &hexout)
{
    std::vector<unsigned char> key = ParseHex(hexkey);
    std::vector<unsigned char> iv = ParseHex(hexiv);
    std::vector<unsigned char> in = ParseHex(hexin);
    std::vector<unsigned char> correctout = ParseHex(hexout);
    std::vector<unsigned char> realout(in.size() + AES_BLOCKSIZE);

    // Encrypt the plaintext and verify that it equals the cipher
    AES256CBCEncrypt enc(key.data(), iv.data(), pad);
    int size = enc.Encrypt(in.data(), in.size(), realout.data());
    realout.resize(size);
    BOOST_CHECK(realout.size() == correctout.size());
    BOOST_CHECK_MESSAGE(realout == correctout, HexStr(realout) + std::string(" != ") + hexout);

    // Decrypt the cipher and verify that it equals the plaintext
    std::vector<unsigned char> decrypted(correctout.size());
    AES256CBCDecrypt dec(key.data(), iv.data(), pad);
    size = dec.Decrypt(correctout.data(), correctout.size(), decrypted.data());
    decrypted.resize(size);
    BOOST_CHECK(decrypted.size() == in.size());
    BOOST_CHECK_MESSAGE(decrypted == in, HexStr(decrypted) + std::string(" != ") + hexin);

    // Encrypt and re-decrypt substrings of the plaintext and verify that they equal each-other
    for(std::vector<unsigned char>::iterator i(in.begin()); i != in.end(); ++i)
    {
        std::vector<unsigned char> sub(i, in.end());
        std::vector<unsigned char> subout(sub.size() + AES_BLOCKSIZE);
        int _size = enc.Encrypt(sub.data(), sub.size(), subout.data());
        if (_size != 0)
        {
            subout.resize(_size);
            std::vector<unsigned char> subdecrypted(subout.size());
            _size = dec.Decrypt(subout.data(), subout.size(), subdecrypted.data());
            subdecrypted.resize(_size);
            BOOST_CHECK(decrypted.size() == in.size());
            BOOST_CHECK_MESSAGE(subdecrypted == sub, HexStr(subdecrypted) + std::string(" != ") + HexStr(sub));
        }
    }
}